

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  reference ppSVar2;
  const_iterator cStack_48;
  bool result_1;
  _Self local_40;
  CIt i_1;
  const_iterator cStack_30;
  bool result;
  _Self local_28;
  CIt i;
  string *filename_local;
  cmFileLockPool *this_local;
  
  i._M_node = (_List_node_base *)filename;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
       ::begin(&this->FunctionScopes);
  while( true ) {
    cStack_30 = std::__cxx11::
                list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::end
                          (&this->FunctionScopes);
    bVar1 = std::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar1) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::begin
                     (&this->FileScopes);
      while( true ) {
        cStack_48 = std::__cxx11::
                    list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                    ::end(&this->FileScopes);
        bVar1 = std::operator!=(&local_40,&stack0xffffffffffffffb8);
        if (!bVar1) {
          bVar1 = ScopePool::IsAlreadyLocked(&this->ProcessScope,(string *)i._M_node);
          return bVar1;
        }
        ppSVar2 = std::_List_const_iterator<cmFileLockPool::ScopePool_*>::operator*(&local_40);
        bVar1 = ScopePool::IsAlreadyLocked(*ppSVar2,(string *)i._M_node);
        if (bVar1) break;
        std::_List_const_iterator<cmFileLockPool::ScopePool_*>::operator++(&local_40);
      }
      return true;
    }
    ppSVar2 = std::_List_const_iterator<cmFileLockPool::ScopePool_*>::operator*(&local_28);
    i_1._M_node._7_1_ = ScopePool::IsAlreadyLocked(*ppSVar2,(string *)i._M_node);
    if ((bool)i_1._M_node._7_1_) break;
    std::_List_const_iterator<cmFileLockPool::ScopePool_*>::operator++(&local_28);
  }
  return true;
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (CIt i = this->FunctionScopes.begin();
      i != this->FunctionScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  for (CIt i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  return this->ProcessScope.IsAlreadyLocked(filename);
}